

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LHcubemap.hpp
# Opt level: O3

GLuint buildLHcubemap(char *filename)

{
  float *data;
  GLuint texture;
  
  github111116::ConsoleLogger::log<char[27]>(&console,(char (*) [27])"building cubemap L_H(N)...");
  data = (float *)operator_new__(0xfd20000);
  calculate_LHcubemap(filename,data,0x80);
  (*glad_glGenTextures)(1,&texture);
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindTexture)(0x9009,texture);
  (*glad_glTexParameteri)(0x9009,0x2800,0x2601);
  (*glad_glTexParameteri)(0x9009,0x2801,0x2601);
  (*glad_glTexParameteri)(0x9009,0x8072,0x812f);
  (*glad_glTexParameteri)(0x9009,0x2802,0x812f);
  (*glad_glTexParameteri)(0x9009,0x2803,0x812f);
  (*glad_glTexImage3D)(0x9009,0,0x8815,0x80,0x80,0x546,0,0x1907,0x1406,data);
  operator_delete__(data);
  return texture;
}

Assistant:

GLuint buildLHcubemap(const char* filename)
{
	console.log("building cubemap L_H(N)...");
	const int size = 128;
	float *data = new float[N_COEFFS*6*size*size*3];

	calculate_LHcubemap(filename, data, size);
	// create & bind a named texture
	GLuint texture;
	glGenTextures(1, &texture);
	glActiveTexture(GL_TEXTURE0);
	glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, texture);
	// set the texture wrapping/filtering options (on the currently bound texture object)
	glTexParameteri( GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	glTexParameteri( GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	glTexParameteri( GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
	glTexParameteri( GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	glTexParameteri( GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	// generate the texture
	glTexImage3D( GL_TEXTURE_CUBE_MAP_ARRAY, 0, GL_RGB32F, size, size, N_COEFFS*6, 0, GL_RGB, GL_FLOAT, data);

	delete [] data;
	return texture;
}